

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::rehash
          (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *this,size_t sizeHint)

{
  QString *key;
  ulong uVar1;
  Span *pSVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Node<QString,_QHashDummyValue> *pNVar6;
  ulong uVar7;
  Span *pSVar8;
  size_t index;
  long lVar9;
  size_t sVar10;
  long lVar11;
  R RVar12;
  Bucket BVar13;
  QStringView QVar14;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar10 = 0x80;
  if ((0x40 < sizeHint) && (sVar10 = 0xffffffffffffffff, sizeHint < 0x4000000000000000)) {
    lVar9 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    sVar10 = 1L << (0x41 - ((byte)lVar9 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar12 = allocateSpans(sVar10);
  this->spans = (Span *)RVar12.spans;
  this->numBuckets = sVar10;
  if (0x7f < uVar1) {
    uVar7 = 0;
    pSVar8 = pSVar2;
    do {
      lVar9 = 0;
      do {
        if ((ulong)pSVar8->offsets[lVar9] != 0xff) {
          key = (QString *)(pSVar2[uVar7].entries + pSVar8->offsets[lVar9]);
          QVar14.m_data = (key->d).ptr;
          QVar14.m_size = (key->d).size;
          sVar10 = qHash(QVar14,this->seed);
          BVar13 = findBucketWithHash<QString>(this,key,sVar10);
          pNVar6 = Span<QHashPrivate::Node<QString,_QHashDummyValue>_>::insert
                             (BVar13.span,BVar13.index);
          pDVar3 = (key->d).d;
          (key->d).d = (Data *)0x0;
          (pNVar6->key).d.d = pDVar3;
          pcVar4 = (key->d).ptr;
          (key->d).ptr = (char16_t *)0x0;
          (pNVar6->key).d.ptr = pcVar4;
          qVar5 = (key->d).size;
          (key->d).size = 0;
          (pNVar6->key).d.size = qVar5;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      Span<QHashPrivate::Node<QString,_QHashDummyValue>_>::freeData(pSVar2 + uVar7);
      uVar7 = uVar7 + 1;
      pSVar8 = pSVar8 + 1;
    } while (uVar7 != uVar1 >> 7);
  }
  if (pSVar2 != (Span *)0x0) {
    lVar9 = *(long *)&pSVar2[-1].allocated;
    if (lVar9 != 0) {
      lVar11 = lVar9 * 0x90;
      do {
        Span<QHashPrivate::Node<QString,_QHashDummyValue>_>::freeData
                  ((Span<QHashPrivate::Node<QString,_QHashDummyValue>_> *)
                   (pSVar2[-1].offsets + lVar11));
        lVar11 = lVar11 + -0x90;
      } while (lVar11 != 0);
    }
    operator_delete__(&pSVar2[-1].allocated,lVar9 * 0x90 + 8);
    return;
  }
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }